

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::getQualifierName
          (SSBLayoutQualifierConflictTest *this,QUALIFIERS qualifier)

{
  TestError *this_00;
  char *local_20;
  GLchar *name;
  QUALIFIERS qualifier_local;
  SSBLayoutQualifierConflictTest *this_local;
  
  switch(qualifier) {
  case DEFAULT:
    local_20 = "";
    break;
  case STD140:
    local_20 = "std140";
    break;
  case STD430:
    local_20 = "std430";
    break;
  case SHARED:
    local_20 = "shared";
    break;
  case PACKED:
    local_20 = "packed";
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x2acf);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_20;
}

Assistant:

const GLchar* SSBLayoutQualifierConflictTest::getQualifierName(QUALIFIERS qualifier)
{
	const GLchar* name = "";

	switch (qualifier)
	{
	case DEFAULT:
		name = "";
		break;
	case STD140:
		name = "std140";
		break;
	case STD430:
		name = "std430";
		break;
	case SHARED:
		name = "shared";
		break;
	case PACKED:
		name = "packed";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return name;
}